

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_astc.h
# Opt level: O1

void __thiscall
ktx::OptionsEncodeASTC::process
          (OptionsEncodeASTC *this,Options *param_1,ParseResult *args,Reporter *report)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  int iVar7;
  OptionValue *pOVar8;
  iterator iVar9;
  uint uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long lVar12;
  size_type sVar13;
  string qualityLevelStr;
  undefined1 local_137;
  undefined1 local_136;
  undefined1 local_135;
  ktx_pack_astc_quality_levels_e local_134;
  Reporter *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  ktx_pack_astc_quality_levels_e local_108 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_58;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,kAstcQuality,(allocator<char> *)&local_134);
  pOVar8 = cxxopts::ParseResult::operator[](args,&local_f8.first);
  sVar4 = pOVar8->m_count;
  paVar1 = &local_f8.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.first._M_dataplus._M_p,local_f8.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (sVar4 == 0) {
    uVar2 = (this->qualityLevel).min;
    uVar3 = (this->qualityLevel).max;
    uVar10 = 0x3c;
    if (uVar3 < 0x3c) {
      uVar10 = uVar3;
    }
    if (0x3c < uVar2) {
      uVar10 = uVar2;
    }
    *(this->qualityLevel).option = uVar10;
  }
  else {
    local_130 = report;
    if (process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
        astc_quality_mapping_abi_cxx11_ == '\0') {
      iVar7 = __cxa_guard_acquire(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                                   astc_quality_mapping_abi_cxx11_);
      if (iVar7 != 0) {
        local_134 = KTX_PACK_ASTC_QUALITY_LEVEL_FASTEST;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
        ::pair<const_char_(&)[8],_ktx_pack_astc_quality_levels_e,_true>
                  (&local_f8,(char (*) [8])"fastest",&local_134);
        local_108[3] = 10;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
        ::pair<const_char_(&)[5],_ktx_pack_astc_quality_levels_e,_true>
                  (&local_d0,(char (*) [5])"fast",local_108 + 3);
        local_108[2] = 0x3c;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
        ::pair<const_char_(&)[7],_ktx_pack_astc_quality_levels_e,_true>
                  (&local_a8,(char (*) [7])"medium",local_108 + 2);
        local_108[1] = 0x62;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
        ::pair<const_char_(&)[9],_ktx_pack_astc_quality_levels_e,_true>
                  (&local_80,(char (*) [9])"thorough",local_108 + 1);
        local_108[0] = KTX_PACK_ASTC_QUALITY_LEVEL_EXHAUSTIVE;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
        ::pair<const_char_(&)[11],_ktx_pack_astc_quality_levels_e,_true>
                  (&local_58,(char (*) [11])"exhaustive",local_108);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>,std::allocator<std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_Hashtable<std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>const*>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>,std::allocator<std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                       astc_quality_mapping_abi_cxx11_,&local_f8,&stack0xffffffffffffffd0,0,
                   &local_135,&local_136,&local_137);
        lVar12 = -200;
        paVar11 = &local_58.first.field_2;
        do {
          if (paVar11 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar11->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar11->_M_allocated_capacity)[-2],
                            paVar11->_M_allocated_capacity + 1);
          }
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar11->_M_allocated_capacity + -5);
          lVar12 = lVar12 + 0x28;
        } while (lVar12 != 0);
        __cxa_atexit(std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
                     ::~unordered_map,
                     &process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                      astc_quality_mapping_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                             astc_quality_mapping_abi_cxx11_);
      }
    }
    captureASTCOption<std::__cxx11::string>(&local_128,this,args,kAstcQuality);
    sVar6 = local_128._M_string_length;
    _Var5._M_p = local_128._M_dataplus._M_p;
    if (local_128._M_string_length != 0) {
      sVar13 = 0;
      do {
        iVar7 = tolower((int)_Var5._M_p[sVar13]);
        _Var5._M_p[sVar13] = (char)iVar7;
        sVar13 = sVar13 + 1;
      } while (sVar6 != sVar13);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p == &local_128.field_2) {
      local_f8.first.field_2._8_8_ = local_128.field_2._8_8_;
      local_f8.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f8.first._M_dataplus._M_p = local_128._M_dataplus._M_p;
    }
    local_f8.first.field_2._M_allocated_capacity._1_7_ =
         local_128.field_2._M_allocated_capacity._1_7_;
    local_f8.first.field_2._M_local_buf[0] = local_128.field_2._M_local_buf[0];
    local_f8.first._M_string_length = local_128._M_string_length;
    local_128._M_string_length = 0;
    local_128.field_2._M_local_buf[0] = '\0';
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    iVar9 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                    astc_quality_mapping_abi_cxx11_._M_h,&local_f8.first);
    if (iVar9.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_true>
        ._M_cur == (__node_type *)0x0) {
      Reporter::fatal_usage<char_const(&)[27],std::__cxx11::string_const&>
                (local_130,(char (*) [27])"Invalid astc-quality: \"{}\"",&local_f8.first);
    }
    uVar2 = *(uint *)((long)iVar9.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_true>
                            ._M_cur + 0x28);
    uVar3 = (this->qualityLevel).min;
    uVar10 = (this->qualityLevel).max;
    if (uVar2 <= uVar10) {
      uVar10 = uVar2;
    }
    if (uVar2 < uVar3) {
      uVar10 = uVar3;
    }
    *(this->qualityLevel).option = uVar10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8.first._M_dataplus._M_p,
                      local_f8.first.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,kAstcPerceptual,(allocator<char> *)&local_134);
  pOVar8 = cxxopts::ParseResult::operator[](args,&local_f8.first);
  sVar4 = pOVar8->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.first._M_dataplus._M_p,local_f8.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (sVar4 != 0) {
    captureASTCOption(this,kAstcPerceptual);
    (this->super_ktxAstcParams).perceptual = true;
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        if (args[kAstcQuality].count()) {
            static std::unordered_map<std::string, ktx_pack_astc_quality_levels_e> astc_quality_mapping{
                    {"fastest", KTX_PACK_ASTC_QUALITY_LEVEL_FASTEST},
                    {"fast", KTX_PACK_ASTC_QUALITY_LEVEL_FAST},
                    {"medium", KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM},
                    {"thorough", KTX_PACK_ASTC_QUALITY_LEVEL_THOROUGH},
                    {"exhaustive", KTX_PACK_ASTC_QUALITY_LEVEL_EXHAUSTIVE}
            };
            const auto qualityLevelStr = to_lower_copy(captureASTCOption<std::string>(args, kAstcQuality));
            const auto it = astc_quality_mapping.find(qualityLevelStr);
            if (it == astc_quality_mapping.end())
                report.fatal_usage("Invalid astc-quality: \"{}\"", qualityLevelStr);
            qualityLevel = it->second;
        } else {
            qualityLevel = KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM;
        }

        if (args[kAstcPerceptual].count()) {
            captureASTCOption(kAstcPerceptual);
            perceptual = KTX_TRUE;
        }
    }